

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.h
# Opt level: O0

Statistic * __thiscall LinkList<Statistic>::Get(LinkList<Statistic> *this,int index)

{
  int iVar1;
  int local_2c;
  InternalNode *pIStack_28;
  int iRelToMiddle;
  InternalNode *pnTemp;
  int iCur;
  int index_local;
  LinkList<Statistic> *this_local;
  
  if ((index < 0) || (this->iLength <= index)) {
    this_local = (LinkList<Statistic> *)0x0;
  }
  else {
    iVar1 = index + 1;
    if (this->iLastRef == -1) {
      if (iVar1 < this->iLength - iVar1) {
        pnTemp._0_4_ = 1;
        pIStack_28 = this->pnHead;
      }
      else {
        pnTemp._0_4_ = this->iLength;
        pIStack_28 = this->pnTail;
      }
    }
    else {
      if (iVar1 < this->iLastRef) {
        local_2c = this->iLastRef - iVar1;
      }
      else {
        local_2c = iVar1 - this->iLastRef;
      }
      if (iVar1 < local_2c) {
        pnTemp._0_4_ = 1;
        pIStack_28 = this->pnHead;
      }
      else if (local_2c < this->iLength - iVar1) {
        pnTemp._0_4_ = this->iLastRef;
        pIStack_28 = this->pnLastRef;
      }
      else {
        pnTemp._0_4_ = this->iLength;
        pIStack_28 = this->pnTail;
      }
    }
    while ((int)pnTemp != iVar1) {
      if ((int)pnTemp < iVar1) {
        pnTemp._0_4_ = (int)pnTemp + 1;
        pIStack_28 = pIStack_28->next;
      }
      else {
        pnTemp._0_4_ = (int)pnTemp + -1;
        pIStack_28 = pIStack_28->previous;
      }
    }
    this->iLastRef = iVar1;
    this->pnLastRef = pIStack_28;
    this_local = (LinkList<Statistic> *)this->pnLastRef;
  }
  return (Statistic *)this_local;
}

Assistant:

inline T* LinkList<T>::Get(int index)
{
	int iCur;               // Position to start search from
	InternalNode *pnTemp;   // Node to start search from
	int iRelToMiddle;       // Position asked for relative to last ref

   // Make sure that item is within bounds
	if (index < 0 || index >= iLength)
		return NULL;

   // Having the index be base 1 makes this procedure much easier.
   index++;

	if (iLastRef==-1)
		if (index < (iLength-index)) {
			iCur = 1;
			pnTemp = pnHead;
		} else {
			iCur = iLength;
			pnTemp = pnTail;
		}
	else
		{
			if (index < iLastRef)
				iRelToMiddle = iLastRef - index;
			else
				iRelToMiddle = index - iLastRef;

			if (index < iRelToMiddle) {
				// The head is closest to requested element
				iCur = 1;
				pnTemp = pnHead;
			}
			else
				if (iRelToMiddle < (iLength - index)) {
					iCur = iLastRef;
					pnTemp = pnLastRef;
				} else {
					iCur = iLength;
					pnTemp = pnTail;
				}
		}

	// Now starting from the decided upon first element
	// find the desired element
	while (iCur != index)
		if (iCur < index) {
			iCur++;
			pnTemp = pnTemp->next;
		} else {
			iCur--;
			pnTemp = pnTemp->previous;
		}

	iLastRef = index;
	pnLastRef = pnTemp;

   return &(pnLastRef->Data);
}